

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryLightsLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryLightsLoader::begin__light
          (LibraryLightsLoader *this,light__AttributeData *attributeData)

{
  Light *pLVar1;
  ParserChar *colladaId;
  allocator<char> local_39;
  UniqueId local_38;
  
  pLVar1 = (Light *)operator_new(400);
  IFilePartLoader::createUniqueIdFromId(&local_38,(IFilePartLoader *)this,attributeData->id,LIGHT);
  COLLADAFW::Light::Light(pLVar1,&local_38);
  this->mCurrentLight = pLVar1;
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  if (attributeData->name == (char *)0x0) {
    if (attributeData->id != (char *)0x0) {
      pLVar1 = this->mCurrentLight;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pLVar1->mName);
      goto LAB_007feb55;
    }
  }
  else {
    pLVar1 = this->mCurrentLight;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->name,&local_39);
    std::__cxx11::string::_M_assign((string *)&pLVar1->mName);
LAB_007feb55:
    if (local_38._0_8_ != (long)&local_38 + 0x10U) {
      operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
    }
    if (attributeData->id != (char *)0x0) {
      pLVar1 = this->mCurrentLight;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pLVar1->mOriginalId);
      if (local_38._0_8_ != (long)&local_38 + 0x10U) {
        operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
      }
      colladaId = attributeData->id;
      goto LAB_007febbe;
    }
  }
  colladaId = (char *)0x0;
LAB_007febbe:
  IFilePartLoader::addToSidTree((IFilePartLoader *)this,colladaId,(char *)0x0);
  return true;
}

Assistant:

bool LibraryLightsLoader::begin__light( const light__AttributeData& attributeData )
	{
		mCurrentLight = FW_NEW COLLADAFW::Light( createUniqueIdFromId( attributeData.id, COLLADAFW::Light::ID()));

		if ( attributeData.name )
			mCurrentLight->setName( (const char*) attributeData.name );
		else if ( attributeData.id )
			mCurrentLight->setName( (const char*) attributeData.id );

        if ( attributeData.id )
            mCurrentLight->setOriginalId ( (const char*)attributeData.id );

		addToSidTree( attributeData.id, 0);

		return true;	
	}